

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.hpp
# Opt level: O0

ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
* __thiscall
memory::
ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
::operator=(ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
            *this,value_type value)

{
  size_type sVar1;
  value_type value_local;
  ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  *this_local;
  
  sVar1 = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
          ::size(&this->
                  super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
                );
  if (sVar1 != 0) {
    HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>::set
              ((HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>
                *)this,&this->
                        super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
               ,value);
  }
  return this;
}

Assistant:

ArrayReference& operator = (value_type value) {
#ifdef VERBOSE
        std::cerr << util::pretty_printer<ArrayReference>::print(*this)
                  << "::" << util::blue("operator=") << "(" << value << ")"
                  << std::endl;
#endif
        if(size()>0) {
            base::coordinator_.set(*this, value);
        }

        return *this;
    }